

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void gimage::imageToJET<float>
               (ImageU8 *ret,Image<float,_gimage::PixelTraits<float>_> *image,double imin,
               double imax)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  work_t wVar5;
  store_t_conflict sVar6;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double b;
  double g;
  double r;
  double v;
  long i;
  long k;
  double irange;
  long in_stack_ffffffffffffff08;
  double in_stack_ffffffffffffff10;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffff18;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffff20;
  double dVar7;
  long in_stack_ffffffffffffff48;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffff60;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  long local_30;
  double local_28;
  double local_20;
  double local_18;
  Image<float,_gimage::PixelTraits<float>_> *local_10;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_8;
  
  local_20 = in_XMM1_Qa;
  local_18 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_8 = in_RDI;
  lVar2 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            (in_stack_ffffffffffffff60,lVar2,(long)in_RDI,in_stack_ffffffffffffff48);
  if (local_20 <= local_18) {
    wVar5 = Image<float,_gimage::PixelTraits<float>_>::minValue(in_stack_ffffffffffffff20);
    local_18 = (double)wVar5;
    wVar5 = Image<float,_gimage::PixelTraits<float>_>::maxValue(in_stack_ffffffffffffff20);
    local_20 = (double)wVar5;
  }
  local_28 = local_20 - local_18;
  if (0.0 < local_28) {
    local_30 = 0;
    while( true ) {
      lVar2 = local_30;
      lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
      if (lVar3 <= lVar2) break;
      local_38 = 0;
      while( true ) {
        lVar2 = local_38;
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
        if (lVar3 <= lVar2) break;
        bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValid
                          (in_stack_ffffffffffffff18,(long)in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff08);
        if (bVar1) {
          sVar6 = Image<float,_gimage::PixelTraits<float>_>::get(local_10,local_38,local_30,0);
          local_40 = (((double)sVar6 - local_18) / local_28) / 1.15 + 0.1;
          local_50 = 0.0;
          dVar7 = 1.0;
          local_58 = 1.0;
          in_stack_ffffffffffffff10 = -4.0;
          in_stack_ffffffffffffff18 =
               (Image<float,_gimage::PixelTraits<float>_> *)0x3ff8000000000000;
          local_60 = ABS(local_40 + -0.75) * -4.0 + 1.5;
          pdVar4 = std::min<double>(&local_58,&local_60);
          pdVar4 = std::max<double>(&local_50,pdVar4);
          local_48 = *pdVar4;
          local_70 = 0.0;
          local_80 = ABS(local_40 - 0.5) * in_stack_ffffffffffffff10 +
                     (double)in_stack_ffffffffffffff18;
          local_78 = dVar7;
          pdVar4 = std::min<double>(&local_78,&local_80);
          pdVar4 = std::max<double>(&local_70,pdVar4);
          local_68 = *pdVar4;
          local_90 = 0.0;
          local_98 = dVar7;
          pdVar4 = std::min<double>(&local_98,(double *)&stack0xffffffffffffff60);
          pdVar4 = std::max<double>(&local_90,pdVar4);
          local_88 = *pdVar4;
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_8,local_38,local_30,0,(store_t)(int)(local_48 * 255.0 + 0.5));
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_8,local_38,local_30,1,(store_t)(int)(local_68 * 255.0 + 0.5));
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_8,local_38,local_30,2,(store_t)(int)(local_88 * 255.0 + 0.5));
        }
        else {
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_8,local_38,local_30,0,'\0');
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_8,local_38,local_30,1,'\0');
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_8,local_38,local_30,2,'\0');
        }
        local_38 = local_38 + 1;
      }
      local_30 = local_30 + 1;
    }
  }
  else {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void imageToJET(ImageU8 &ret, const Image<T> &image, double imin=0, double imax=-1)
{
  ret.setSize(image.getWidth(), image.getHeight(), 3);

  if (imax <= imin)
  {
    imin=image.minValue();
    imax=image.maxValue();
  }

  double irange=imax-imin;

  if (irange <= 0)
  {
    ret.clear();
    return;
  }

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      if (image.isValid(i, k))
      {
        double v=image.get(i, k, 0);

        v=(v-imin)/irange;
        v=v/1.15+0.1;

        double r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
        double g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
        double b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));

        ret.set(i, k, 0, static_cast<unsigned char>(255*r+0.5));
        ret.set(i, k, 1, static_cast<unsigned char>(255*g+0.5));
        ret.set(i, k, 2, static_cast<unsigned char>(255*b+0.5));
      }
      else
      {
        ret.set(i, k, 0, 0);
        ret.set(i, k, 1, 0);
        ret.set(i, k, 2, 0);
      }
    }
  }
}